

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageReceiver.cpp
# Opt level: O2

int __thiscall unixsocketipc::MessageReceiver::init(MessageReceiver *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  function<void_()> *in_RCX;
  function<void_(unsigned_int,_const_char_*,_unsigned_int)> *in_RDX;
  uint uVar4;
  sockaddr_un local;
  
  std::__cxx11::string::assign((char *)&this->socket_filename);
  uVar4 = 0;
  iVar1 = socket(1,1,0);
  this->server_socket_fd = iVar1;
  if (iVar1 != -1) {
    pcVar2 = (char *)operator_new__(0x100000);
    this->message_buf = pcVar2;
    pcVar2 = local.sun_path;
    local.sun_family = 1;
    strcpy(pcVar2,(this->socket_filename)._M_dataplus._M_p);
    unlink(pcVar2);
    sVar3 = strlen(pcVar2);
    iVar1 = bind(this->server_socket_fd,(sockaddr *)&local,(int)sVar3 + 2);
    uVar4 = (uint)(iVar1 != -1);
    if (iVar1 == -1) {
      close(this->server_socket_fd);
    }
    else {
      std::function<void_(unsigned_int,_const_char_*,_unsigned_int)>::operator=
                (&this->callback,in_RDX);
      std::function<void_()>::operator=(&this->on_client_connected,in_RCX);
    }
  }
  return uVar4;
}

Assistant:

bool MessageReceiver::init(const char *filename, CallbackFunc cb, OnClientConnected oc) {
   // remember socket filename
   socket_filename = filename;

   // get a socket filedescriptor
   server_socket_fd = socket(AF_UNIX, SOCK_STREAM, 0);

   // check socket for failure
   if (server_socket_fd == -1) {
      DEBUG_MSG("%s: socket(AF_UNIX, SOCK_STREAM, 0) failed\n", __FUNCTION__);
      return false;
   }

   // prepare buffer
   message_buf = new char[MESSAGE_BUFF_SIZE];

   DEBUG_MSG("%s: binding to %s...\n", __FUNCTION__, socket_filename.c_str());
      // prepare address struct
      sockaddr_un local;
      local.sun_family = AF_UNIX;

      strcpy(local.sun_path, socket_filename.c_str());

      // delete socket file if such already exists
      unlink(local.sun_path);

      // bind socket to address in UNIX domain
      unsigned local_length = strlen(local.sun_path) + sizeof(local.sun_family);
      if (bind(server_socket_fd, (sockaddr*)&local, local_length) == -1) {
         DEBUG_MSG("%s: bind failed\n", __FUNCTION__);
         ::close(server_socket_fd);
         return false;
      }
   DEBUG_MSG("%s: done.\n", __FUNCTION__);

   // setup callbacks
   callback = cb;
   on_client_connected = oc;

   // success
   return true;
}